

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,double>
               (AggregateFunctionSet *fun,LogicalType *type)

{
  LogicalType *in_RCX;
  duckdb *this;
  vector<duckdb::LogicalType,_true> by_types;
  duckdb *local_178;
  duckdb *local_170;
  AggregateFunction local_160;
  
  ArgMaxByTypes();
  if (local_178 != local_170) {
    this = local_178;
    do {
      GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,double>
                (&local_160,this,type,in_RCX);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&(fun->super_FunctionSet<duckdb::AggregateFunction>).functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_160);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01966bf8;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      this = this + 0x18;
    } while (this != local_170);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_178);
  return;
}

Assistant:

void AddArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &type) {
	auto by_types = ArgMaxByTypes();
	for (const auto &by_type : by_types) {
#ifndef DUCKDB_SMALLER_BINARY
		fun.AddFunction(GetArgMinMaxFunctionBy<OP, ARG_TYPE>(by_type, type));
#else
		fun.AddFunction(GetArgMinMaxFunctionInternal<OP, string_t, string_t>(by_type, type));
#endif
	}
}